

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_tst_16_pcdi(void)

{
  uint res;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    m68ki_cpu.not_z_flag = OPER_PCDI_16();
    m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 8;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
  }
  return;
}

Assistant:

static void m68k_op_tst_16_pcdi(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint res = OPER_PCDI_16();

		FLAG_N = NFLAG_16(res);
		FLAG_Z = res;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;
		return;
	}
	m68ki_exception_illegal();
}